

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

UText * __thiscall icu_63::RegexMatcher::getInput(RegexMatcher *this,UText *dest,UErrorCode *status)

{
  int destCapacity;
  ulong in_RAX;
  int64_t iVar1;
  UText *pUVar2;
  UChar *dest_00;
  UErrorCode lengthStatus;
  undefined8 uStack_38;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar2 = this->fInputText;
      if (dest == (UText *)0x0) {
        pUVar2 = utext_clone_63((UText *)0x0,pUVar2,'\0','\x01',status);
        return pUVar2;
      }
      if (((pUVar2->chunkNativeStart == 0) && (this->fInputLength == pUVar2->chunkNativeLimit)) &&
         (this->fInputLength == (long)pUVar2->nativeIndexingLimit)) {
        iVar1 = utext_nativeLength_63(dest);
        utext_replace_63(dest,0,iVar1,this->fInputText->chunkContents,(int32_t)this->fInputLength,
                         status);
      }
      else {
        if (pUVar2->pFuncs->mapNativeIndexToUTF16 == (UTextMapNativeIndexToUTF16 *)0x0) {
          destCapacity = (int)this->fInputLength;
          uStack_38 = in_RAX;
        }
        else {
          uStack_38 = in_RAX & 0xffffffff;
          destCapacity = utext_extract_63(pUVar2,0,this->fInputLength,(UChar *)0x0,0,
                                          (UErrorCode *)((long)&uStack_38 + 4));
        }
        dest_00 = (UChar *)uprv_malloc_63((long)destCapacity * 2);
        if (dest_00 != (UChar *)0x0) {
          *status = U_ZERO_ERROR;
          utext_extract_63(this->fInputText,0,this->fInputLength,dest_00,destCapacity,status);
          *status = U_ZERO_ERROR;
          iVar1 = utext_nativeLength_63(dest);
          utext_replace_63(dest,0,iVar1,dest_00,destCapacity,status);
          uprv_free_63(dest_00);
        }
      }
    }
    else {
      *status = this->fDeferredStatus;
    }
  }
  return dest;
}

Assistant:

UText *RegexMatcher::getInput (UText *dest, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return dest;
    }

    if (dest) {
        if (UTEXT_FULL_TEXT_IN_CHUNK(fInputText, fInputLength)) {
            utext_replace(dest, 0, utext_nativeLength(dest), fInputText->chunkContents, (int32_t)fInputLength, &status);
        } else {
            int32_t input16Len;
            if (UTEXT_USES_U16(fInputText)) {
                input16Len = (int32_t)fInputLength;
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                input16Len = utext_extract(fInputText, 0, fInputLength, NULL, 0, &lengthStatus); // buffer overflow error
            }
            UChar *inputChars = (UChar *)uprv_malloc(sizeof(UChar)*(input16Len));
            if (inputChars == NULL) {
                return dest;
            }

            status = U_ZERO_ERROR;
            utext_extract(fInputText, 0, fInputLength, inputChars, input16Len, &status); // not terminated warning
            status = U_ZERO_ERROR;
            utext_replace(dest, 0, utext_nativeLength(dest), inputChars, input16Len, &status);

            uprv_free(inputChars);
        }
        return dest;
    } else {
        return utext_clone(NULL, fInputText, FALSE, TRUE, &status);
    }
}